

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O1

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
union_vertices(Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               *this,Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                     *a)

{
  _Rb_tree_header *__position;
  pointer pVVar1;
  pointer __v;
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  v;
  _Alloc_node __an;
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  local_48;
  _Alloc_node local_30;
  
  local_48.
  super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ._M_impl.super__Vector_impl_data._M_start = (Vertex_handle *)0x0;
  local_48.
  super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Vertex_handle *)0x0;
  local_48.
  super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::reserve(&local_48,
            (a->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count +
            (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __position = &(this->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  std::
  __set_union<std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::back_insert_iterator<std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,__position,
             (a->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(a->simplex_set)._M_t._M_impl.super__Rb_tree_header,&local_48);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::clear((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
           *)this);
  pVVar1 = local_48.
           super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_30._M_t =
       (_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
        *)this;
  if (local_48.
      super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __v = local_48.
          super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
      ::
      _M_insert_unique_<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle&,std::_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>::_Alloc_node>
                ((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
                  *)this,(const_iterator)__position,__v,&local_30);
      __v = __v + 1;
    } while (__v != pVVar1);
  }
  if (local_48.
      super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ._M_impl.super__Vector_impl_data._M_start != (Vertex_handle *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void union_vertices(const Skeleton_blocker_simplex & a) {
    std::vector<T> v;
    v.reserve(simplex_set.size() + a.simplex_set.size());

    set_union(simplex_set.begin(), simplex_set.end(), a.simplex_set.begin(),
              a.simplex_set.end(), std::back_inserter(v));
    clear();
    simplex_set.insert(v.begin(), v.end());
  }